

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinHeap.h
# Opt level: O1

void __thiscall
sznet::MinHeap<sznet::Timer>::shiftUp_(MinHeap<sznet::Timer> *this,uint32_t hole_index,Timer *e)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  if (hole_index != 0) {
    uVar3 = hole_index - 1;
    do {
      uVar1 = uVar3 >> 1;
      iVar2 = (*this->m_pCmpFunc)(this->m_ptrArr[uVar1],e);
      if (iVar2 != 1) break;
      uVar3 = uVar1 - 1;
      this->m_ptrArr[hole_index] = this->m_ptrArr[uVar1];
      (this->m_ptrArr[hole_index]->super_MinHeaBaseElem).min_heap_idx = hole_index;
      hole_index = uVar1;
    } while (uVar1 != 0);
  }
  this->m_ptrArr[hole_index] = e;
  (this->m_ptrArr[hole_index]->super_MinHeaBaseElem).min_heap_idx = hole_index;
  return;
}

Assistant:

void shiftUp_(uint32_t hole_index, T* e)
	{
		uint32_t parent_index = parent(hole_index);
		// 循环向上给e找个适合的位置
		while ((hole_index > 0) && m_pCmpFunc(m_ptrArr[parent_index], e) == 1)
		{
			m_ptrArr[hole_index] = m_ptrArr[parent_index];
			m_ptrArr[hole_index]->min_heap_idx = hole_index;
			hole_index = parent_index;
			parent_index = parent(hole_index);
		}
		m_ptrArr[hole_index] = e;
		m_ptrArr[hole_index]->min_heap_idx = hole_index;
	}